

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-vocab.cpp
# Opt level: O0

void __thiscall
llm_tokenizer_spm_session::resegment
          (llm_tokenizer_spm_session *this,llm_symbol *symbol,
          vector<int,_std::allocator<int>_> *output)

{
  pointer plVar1;
  pointer plVar2;
  bool bVar3;
  llama_token lVar4;
  pointer ppVar5;
  llm_symbol *in_RDX;
  llm_tokenizer_spm_session *in_RSI;
  vector<int,_std::allocator<int>_> *in_RDI;
  uint8_t in_stack_00000027;
  llama_vocab *in_stack_00000028;
  llama_token id;
  int j;
  iterator p;
  llama_token token;
  string text;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_int>_>_>_>
  *in_stack_ffffffffffffff38;
  value_type_conflict3 *in_stack_ffffffffffffff48;
  pointer *this_00;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  llama_vocab *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff68;
  int local_6c;
  _Self local_68;
  _Self local_60;
  undefined4 local_54;
  llama_token local_50;
  allocator local_39;
  string local_38 [24];
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffe0;
  
  plVar1 = (in_RSI->symbols).super__Vector_base<llm_symbol,_std::allocator<llm_symbol>_>._M_impl.
           super__Vector_impl_data._M_start;
  plVar2 = (in_RSI->symbols).super__Vector_base<llm_symbol,_std::allocator<llm_symbol>_>._M_impl.
           super__Vector_impl_data._M_finish;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,(char *)plVar1,(ulong)plVar2,&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  lVar4 = llama_vocab::text_to_token
                    (in_stack_ffffffffffffff58,
                     (string *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  local_50 = lVar4;
  if (lVar4 == -1) {
    local_60._M_node =
         (_Base_ptr)
         llama_vocab::std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_int>_>_>_>
         ::find(in_stack_ffffffffffffff38,(key_type *)0x542daa);
    local_68._M_node =
         (_Base_ptr)
         llama_vocab::std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_int>_>_>_>
         ::end(in_stack_ffffffffffffff38);
    bVar3 = llama_vocab::std::operator==(&local_60,&local_68);
    if (bVar3) {
      std::vector<int,_std::allocator<int>_>::size((vector<int,_std::allocator<int>_> *)in_RDX);
      llama_vocab::std::vector<int,_std::allocator<int>_>::reserve
                (in_RDI,CONCAT44(lVar4,in_stack_ffffffffffffff68));
      for (local_6c = 0;
          local_6c <
          (int)(in_RSI->symbols).super__Vector_base<llm_symbol,_std::allocator<llm_symbol>_>._M_impl
               .super__Vector_impl_data._M_finish; local_6c = local_6c + 1) {
        lVar4 = llama_vocab::byte_to_token(in_stack_00000028,in_stack_00000027);
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)CONCAT44(lVar4,in_stack_ffffffffffffff50),
                   in_stack_ffffffffffffff48);
      }
      local_54 = 1;
    }
    else {
      this_00 = &(in_RDI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      ppVar5 = llama_vocab::std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_int>_>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_int>_>_>
                             *)0x542eaa);
      llama_vocab::std::vector<llm_symbol,_std::allocator<llm_symbol>_>::operator[]
                ((vector<llm_symbol,_std::allocator<llm_symbol>_> *)this_00,
                 (long)(ppVar5->second).first);
      resegment(in_RSI,in_RDX,in_stack_ffffffffffffffe0);
      ppVar5 = llama_vocab::std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_int>_>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_int>_>_>
                             *)0x542ee7);
      llama_vocab::std::vector<llm_symbol,_std::allocator<llm_symbol>_>::operator[]
                ((vector<llm_symbol,_std::allocator<llm_symbol>_> *)
                 &(in_RDI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_finish,(long)(ppVar5->second).second);
      resegment(in_RSI,in_RDX,in_stack_ffffffffffffffe0);
      local_54 = 0;
    }
  }
  else {
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
               in_stack_ffffffffffffff48);
    local_54 = 1;
  }
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void resegment(llm_symbol & symbol, std::vector<llama_token> & output) {
        auto text = std::string(symbol.text, symbol.n);
        auto token = vocab.text_to_token(text);

        // Do we need to support is_unused?
        if (token != LLAMA_TOKEN_NULL) {
            output.push_back(token);
            return;
        }

        const auto p = rev_merge.find(text);

        if (p == rev_merge.end()) {
            // output any symbols that did not form tokens as bytes.
            output.reserve(output.size() + symbol.n);
            for (int j = 0; j < (int)symbol.n; ++j) {
                llama_token id = vocab.byte_to_token(symbol.text[j]);
                output.push_back(id);
            }
            return;
        }

        resegment(symbols[p->second.first], output);
        resegment(symbols[p->second.second], output);
    }